

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

int refine(saucy *s,coloring *c)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 1;
  do {
    if (s->nsplits == s->n) goto LAB_002b460a;
    iVar1 = s->nsinduce;
    if ((long)iVar1 == 0) {
      iVar1 = s->nninduce;
      if ((long)iVar1 == 0) {
        return 1;
      }
      s->nninduce = iVar1 + -1;
      iVar1 = s->ninduce[(long)iVar1 + -1];
      s->indmark[iVar1] = '\0';
      iVar1 = (*s->ref_nonsingle)(s,c,iVar1);
    }
    else {
      s->nsinduce = iVar1 + -1;
      iVar1 = s->sinduce[(long)iVar1 + -1];
      s->indmark[iVar1] = '\0';
      iVar1 = (*s->ref_singleton)(s,c,iVar1);
    }
  } while (iVar1 != 0);
  iVar2 = 0;
LAB_002b460a:
  clear_refine(s);
  return iVar2;
}

Assistant:

static int
refine(struct saucy *s, struct coloring *c)
{
    int front;

    /* Keep going until refinement stops */
    while (1) {

        /* If discrete, bail */
        if (at_terminal(s)) {
            clear_refine(s);
            return 1;
        };

        /* Look for something else to refine on */
        if (s->nsinduce) {
            front = s->sinduce[--s->nsinduce];
            s->indmark[front] = 0;
            if (!s->ref_singleton(s, c, front)) break;
        }
        else if (s->nninduce) {
            front = s->ninduce[--s->nninduce];
            s->indmark[front] = 0;
            if (!s->ref_nonsingle(s, c, front)) break;
        }
        else {
            return 1;
        };
    }

    clear_refine(s);
    return 0;
}